

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

void __thiscall
QMakeSourceFileInfo::addSourceFile
          (QMakeSourceFileInfo *this,QString *f,uchar seek,SourceFileType type)

{
  long lVar1;
  SourceFile *k;
  char *pcVar2;
  SourceFileType in_ECX;
  undefined1 in_DL;
  SourceFiles *in_RSI;
  QMakeLocalFileName *in_RDI;
  long in_FS_OFFSET;
  SourceFile *file;
  QMakeLocalFileName fn;
  SourceFile *in_stack_00000088;
  QMakeSourceFileInfo *in_stack_00000090;
  QString *in_stack_ffffffffffffff78;
  SourceFile *in_stack_ffffffffffffff80;
  undefined1 own_file;
  SourceFiles *in_stack_ffffffffffffff90;
  undefined3 in_stack_ffffffffffffff9c;
  uint uVar3;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  SourceFile *file_00;
  QMakeSourceFileInfo *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffff9c);
  if ((in_RDI->real_name).d.ptr == (char16_t *)0x0) {
    in_stack_ffffffffffffff80 = (SourceFile *)operator_new(0x10);
    SourceFiles::SourceFiles((SourceFiles *)in_stack_ffffffffffffff80);
    (in_RDI->real_name).d.ptr = (char16_t *)in_stack_ffffffffffffff80;
  }
  memset(&local_38,0,0x30);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  file_00 = (SourceFile *)0xaaaaaaaaaaaaaaaa;
  this_00 = (QMakeSourceFileInfo *)0xaaaaaaaaaaaaaaaa;
  QMakeLocalFileName::QMakeLocalFileName(&in_stack_ffffffffffffff80->file,in_stack_ffffffffffffff78)
  ;
  k = SourceFiles::lookupFile(in_stack_ffffffffffffff90,in_RDI);
  own_file = (undefined1)((ulong)in_RDI >> 0x38);
  if (k == (SourceFile *)0x0) {
    k = (SourceFile *)operator_new(0x40);
    SourceFile::SourceFile(in_stack_ffffffffffffff80);
    QMakeLocalFileName::operator=(&in_stack_ffffffffffffff80->file,&k->file);
    SourceFiles::addFile(in_RSI,(SourceFile *)CONCAT44(uVar3,in_ECX),(char *)k,(bool)own_file);
  }
  else if (((k->type != in_ECX) && (k->type != TYPE_UNKNOWN)) && (in_ECX != TYPE_UNKNOWN)) {
    QString::toLatin1(in_stack_ffffffffffffff78);
    pcVar2 = QByteArray::constData((QByteArray *)0x1d0665);
    warn_msg(WarnLogic,"%s is marked as %d, then %d!",pcVar2,(ulong)k->type,(ulong)in_ECX);
    QByteArray::~QByteArray((QByteArray *)0x1d0692);
  }
  if (in_ECX != TYPE_UNKNOWN) {
    k->type = in_ECX;
  }
  if (((uVar3 & 0x2000000) != 0) && (((byte)k->field_0x3c >> 3 & 1) == 0)) {
    findMocs(this_00,file_00);
  }
  if (((uVar3 & 0x1000000) != 0) && (((byte)k->field_0x3c >> 4 & 1) == 0)) {
    findDeps(in_stack_00000090,in_stack_00000088);
  }
  QMakeLocalFileName::~QMakeLocalFileName(&in_stack_ffffffffffffff80->file);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeSourceFileInfo::addSourceFile(const QString &f, uchar seek,
                                        QMakeSourceFileInfo::SourceFileType type)
{
    if(!files)
        files = new SourceFiles;

    QMakeLocalFileName fn(f);
    SourceFile *file = files->lookupFile(fn);
    if(!file) {
        file = new SourceFile;
        file->file = fn;
        files->addFile(file);
    } else {
        if(file->type != type && file->type != TYPE_UNKNOWN && type != TYPE_UNKNOWN)
            warn_msg(WarnLogic, "%s is marked as %d, then %d!", f.toLatin1().constData(),
                     file->type, type);
    }
    if(type != TYPE_UNKNOWN)
        file->type = type;

    if(seek & SEEK_MOCS && !file->moc_checked)
        findMocs(file);
    if(seek & SEEK_DEPS && !file->dep_checked)
        findDeps(file);
}